

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::PotentialInterfacesManager::getCommand_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PotentialInterfacesManager *this)

{
  _Elt_pointer __str;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  __str = (this->extraCommands).
          super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->extraCommands).
      super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != __str) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &__return_storage_ptr__->second,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__str->second);
    std::
    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_front(&this->extraCommands);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> PotentialInterfacesManager::getCommand()
{
    std::pair<std::string, std::string> cmd;
    if (!extraCommands.empty()) {
        cmd = std::move(extraCommands.front());
        extraCommands.pop_front();
    }
    return cmd;
}